

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O3

Value ** __thiscall
JsUtil::
BaseHashSet<Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
::Lookup(BaseHashSet<Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
         *this,uint *key)

{
  Type this_00;
  Type piVar1;
  Type pSVar2;
  DictionaryStats *pDVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  
  piVar1 = (this->
           super_BaseDictionary<unsigned_int,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
           ).buckets;
  uVar4 = 0;
  if (piVar1 != (Type)0x0) {
    uVar4 = BaseDictionary<unsigned_int,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
            ::GetBucket(*key * 2 + 1,
                        (this->
                        super_BaseDictionary<unsigned_int,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                        ).bucketCount,
                        (this->
                        super_BaseDictionary<unsigned_int,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                        ).modFunctionIndex);
    uVar5 = piVar1[uVar4];
    uVar4 = 0;
    if (-1 < (int)uVar5) {
      pSVar2 = (this->
               super_BaseDictionary<unsigned_int,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
               ).entries;
      uVar4 = 0;
      do {
        this_00 = pSVar2 + uVar5;
        uVar6 = anon_unknown_5::ImplicitKeyValueEntry<unsigned_int,_Value_*>::Key
                          ((ImplicitKeyValueEntry<unsigned_int,_Value_*> *)this_00);
        if (uVar6 == *key) {
          pDVar3 = (this->
                   super_BaseDictionary<unsigned_int,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                   ).stats;
          if (pDVar3 != (DictionaryStats *)0x0) {
            DictionaryStats::Lookup(pDVar3,uVar4);
          }
          return (Value **)
                 ((this->
                  super_BaseDictionary<unsigned_int,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                  ).entries + uVar5);
        }
        uVar4 = uVar4 + 1;
        uVar5 = ((ValueEntryData<Value_*> *)
                &(this_00->
                 super_DefaultHashedEntry<unsigned_int,_Value_*,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
                 ).super_ImplicitKeyValueEntry<unsigned_int,_Value_*>)->next;
      } while (-1 < (int)uVar5);
    }
  }
  pDVar3 = (this->
           super_BaseDictionary<unsigned_int,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
           ).stats;
  if (pDVar3 != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(pDVar3,uVar4);
  }
  return &Lookup::nullElement;
}

Assistant:

TElement const& Lookup(TKey const& key)
        {
            // Use a static to pass the null default value, since the
            // default value may get returned out of the current scope by ref.
            static const TElement nullElement = nullptr;
            return __super::Lookup(key, nullElement);
        }